

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<kj::Own<kj::NetworkAddress>_> __thiscall
kj::anon_unknown_0::ConnectionCountingNetwork::parseAddress
          (ConnectionCountingNetwork *this,StringPtr addr,uint portHint)

{
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  _func_int **pp_Var1;
  Promise<kj::Own<kj::NetworkAddress>_> PVar2;
  Own<kj::_::PromiseNode> OStack_48;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  pp_Var1 = (_func_int **)addr.content.ptr;
  *(int *)pp_Var1[3] = *(int *)pp_Var1[3] + 1;
  (*(code *)**(undefined8 **)pp_Var1[1])(&OStack_48,pp_Var1[1],addr.content.size_);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&OStack_48,
             _::
             TransformPromiseNode<kj::Own<kj::NetworkAddress>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:2843:15),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00426cf8;
  this_00[1].super_PromiseNode._vptr_PromiseNode = pp_Var1;
  local_38.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::NetworkAddress>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::ConnectionCountingNetwork::parseAddress(kj::StringPtr,unsigned_int)::{lambda(kj::Own<kj::NetworkAddress>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_28.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::NetworkAddress>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::ConnectionCountingNetwork::parseAddress(kj::StringPtr,unsigned_int)::{lambda(kj::Own<kj::NetworkAddress>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_38.ptr = (PromiseNode *)0x0;
  (this->super_Network)._vptr_Network =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::NetworkAddress>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::ConnectionCountingNetwork::parseAddress(kj::StringPtr,unsigned_int)::{lambda(kj::Own<kj::NetworkAddress>&&)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (Network *)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::PromiseNode>::dispose(&OStack_48);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::NetworkAddress>_>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint = 0) override {
    ++addrCount;
    return inner.parseAddress(addr, portHint)
        .then([this](Own<NetworkAddress>&& addr) -> Own<NetworkAddress> {
      return kj::heap<CountingNetworkAddress>(kj::mv(addr), count, addrCount);
    });
  }